

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_uuid_link(intptr_t uuid,void *obj,_func_void_void_ptr *on_close)

{
  fio_uuid_links_s *set;
  long *plVar1;
  char *pcVar2;
  undefined1 *puVar3;
  char cVar4;
  undefined1 uVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  fio_data_s *pfVar10;
  fio_data_s *pfVar11;
  ulong *puVar12;
  ulong *puVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  fio_lock_i ret;
  timespec local_48;
  long local_38;
  
  pfVar11 = fio_data;
  if ((uuid < 0) || (uVar23 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar23)) {
LAB_0012aea6:
    piVar14 = __errno_location();
    *piVar14 = 9;
    (*on_close)(obj);
    return;
  }
  lVar15 = (long)(int)uVar23 * 0xa8;
  cVar6 = *(char *)((long)fio_data + lVar15 + 0x6d);
  if (cVar6 != (char)uuid) goto LAB_0012aea6;
  LOCK();
  pcVar2 = (char *)((long)fio_data + lVar15 + 0x6e);
  cVar4 = *pcVar2;
  *pcVar2 = '\x01';
  UNLOCK();
  lVar9 = lVar15;
  local_48.tv_sec._0_1_ = cVar4;
  pfVar10 = fio_data;
  while (fio_data = pfVar10, local_38 = lVar9, (char)local_48.tv_sec != '\0') {
    local_48.tv_sec = 0;
    local_48.tv_nsec = 1;
    nanosleep(&local_48,(timespec *)0x0);
    LOCK();
    pcVar2 = (char *)((long)pfVar11 + lVar15 + 0x6e);
    cVar4 = *pcVar2;
    *pcVar2 = '\x01';
    UNLOCK();
    lVar9 = local_38;
    local_48.tv_sec._0_1_ = cVar4;
    pfVar10 = fio_data;
  }
  if ((pfVar10->capa <= uVar23) ||
     (*(char *)((long)&pfVar10[1].thread_ids.obj + lVar9 + 5) != cVar6)) {
    LOCK();
    puVar3 = (undefined1 *)((long)&pfVar10[1].thread_ids.obj + lVar9 + 6);
    uVar5 = *puVar3;
    *puVar3 = 0;
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar5);
    goto LAB_0012aea6;
  }
  set = (fio_uuid_links_s *)((long)&pfVar10[2].max_protocol_fd + lVar9);
  uVar19 = *(ulong *)((long)&pfVar10[2].max_protocol_fd + lVar9);
  uVar20 = *(ulong *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9);
  if (uVar20 - uVar19 <= uVar19 >> 1) {
    if (uVar20 < *(ulong *)((long)&pfVar10[3].last_cycle.tv_sec + lVar9)) goto LAB_0012add5;
    pcVar2 = (char *)((long)&pfVar10[3].thread_ids.next + lVar9 + 1);
    *pcVar2 = *pcVar2 + '\x01';
  }
  fio_uuid_links_rehash(set);
LAB_0012add5:
  uVar19 = -(ulong)(obj == (void *)0x0) | (ulong)obj;
  lVar15 = *(long *)((long)&pfVar10[3].thread_ids.prev + lVar9);
  if (lVar15 == 0) {
LAB_0012af21:
    lVar15 = *(long *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9);
    lVar16 = *(long *)((long)&pfVar10[3].capa + lVar9);
    lVar18 = lVar15 * 0x10;
    *(_func_void_void_ptr **)(lVar16 + 8 + lVar18) = on_close;
    *(ulong *)(lVar16 + lVar18) = uVar19;
    *(long *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9) = lVar15 + 1;
    plVar1 = (long *)((long)&pfVar10[2].max_protocol_fd + lVar9);
    *plVar1 = *plVar1 + 1;
    fio_uuid_links_rehash(set);
  }
  else {
    if ((*(char *)((long)&pfVar10[3].thread_ids.next + lVar9) != '\0') &&
       (*(long *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9) !=
        *(long *)((long)&pfVar10[2].max_protocol_fd + lVar9))) {
      fio_uuid_links_rehash(set);
      lVar15 = *(long *)((long)&pfVar10[3].thread_ids.prev + lVar9);
    }
    bVar7 = *(byte *)((long)&pfVar10[3].thread_ids.next + lVar9 + 1);
    uVar17 = ~(-1L << (bVar7 & 0x3f));
    uVar20 = 0;
    if (bVar7 != 0) {
      uVar20 = uVar19;
    }
    uVar20 = uVar20 ^ (uVar19 >> (bVar7 & 0x3f) | uVar19 << 0x40 - (bVar7 & 0x3f));
    lVar16 = (uVar20 & uVar17) * 0x10;
    uVar22 = *(ulong *)(lVar15 + lVar16);
    if (uVar22 == uVar19 || uVar22 == 0) {
      puVar12 = (ulong *)(lVar15 + lVar16);
    }
    else {
      uVar22 = *(ulong *)((long)&pfVar10[3].last_cycle.tv_sec + lVar9);
      uVar21 = 0x420;
      if (uVar22 < 0x181) {
        uVar21 = (uVar22 >> 2) * 0xb;
      }
      uVar22 = 0;
      do {
        if (uVar21 <= uVar22) goto LAB_0012af21;
        lVar16 = (uVar20 + 0xb + uVar22 & uVar17) * 0x10;
        puVar12 = (ulong *)(lVar15 + lVar16);
        uVar8 = *(ulong *)(lVar15 + lVar16);
      } while ((uVar8 != 0) && (uVar22 = uVar22 + 0xb, uVar8 != uVar19));
    }
    puVar13 = (ulong *)puVar12[1];
    if (puVar13 == (ulong *)0x0) {
      lVar15 = *(long *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9);
      puVar13 = (ulong *)(lVar15 * 0x10 + *(long *)((long)&pfVar10[3].capa + lVar9));
      puVar12[1] = (ulong)puVar13;
      *(long *)((long)&pfVar10[3].last_cycle.tv_nsec + lVar9) = lVar15 + 1;
      plVar1 = (long *)((long)&pfVar10[2].max_protocol_fd + lVar9);
      *plVar1 = *plVar1 + 1;
    }
    *puVar12 = uVar19;
    *puVar13 = uVar19;
    puVar13[1] = (ulong)on_close;
  }
  LOCK();
  *(undefined1 *)((long)&fio_data[1].thread_ids.obj + lVar9 + 6) = 0;
  UNLOCK();
  return;
}

Assistant:

void fio_uuid_link(intptr_t uuid, void *obj, void (*on_close)(void *obj)) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  fio_uuid_links_overwrite(&uuid_data(uuid).links, (uintptr_t)obj, on_close,
                           NULL);
  fio_unlock(&uuid_data(uuid).sock_lock);
  return;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  on_close(obj);
}